

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passwd.cpp
# Opt level: O2

void __thiscall ui::anon_unknown_0::passwdImpl::~passwdImpl(passwdImpl *this)

{
  ~passwdImpl(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

~passwdImpl() = default;